

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManSimRelPrint(Gia_Man_t *p,Vec_Wrd_t *vRel,Vec_Int_t *vOutMints)

{
  int iVar1;
  word *pwVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint local_40;
  
  iVar3 = p->vSimsPi->nSize / p->vCis->nSize;
  iVar1 = vRel->nSize / iVar3;
  if (0 < iVar3) {
    iVar4 = 1;
    if (1 < iVar3 * 0x40) {
      iVar4 = iVar3 * 0x40;
    }
    local_40 = 0;
    iVar3 = 0;
    do {
      uVar6 = 0;
      if (0 < iVar1) {
        pwVar2 = vRel->pArray;
        uVar6 = 0;
        iVar7 = iVar1;
        uVar5 = local_40;
        do {
          printf("%d",(ulong)((pwVar2[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0));
          pwVar2 = vRel->pArray;
          uVar6 = uVar6 + ((pwVar2[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0);
          uVar5 = uVar5 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      printf("  Count = %2d \n",(ulong)uVar6);
      iVar3 = iVar3 + 1;
      local_40 = local_40 + iVar1;
    } while (iVar3 != iVar4);
  }
  return;
}

Assistant:

void Gia_ManSimRelPrint( Gia_Man_t * p, Vec_Wrd_t * vRel, Vec_Int_t * vOutMints )
{
    int nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    int nMints = Vec_WrdSize(vRel) / nWords; 
    int i, m, Count;
/*
    for ( i = 0; i < 64 * nWords; i++ )
    {
        int k;
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            printf( "%d", Abc_TtGetBit( Vec_WrdEntryP(p->vSimsPi, k), i ) );
        printf( " " );
        Count = 0;
        for ( m = 0; m < nMints; m++ )
        {
            printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        }
        printf( "  Count = %2d ", Count );
        if ( vOutMints )
        {
            printf( "   %3d ", Vec_IntEntry(vOutMints, i) );
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+Vec_IntEntry(vOutMints, i) ) )
                printf( "yes" );
            else
                printf( "no" );
        }
        printf( "\n" );
    }
*/
/*
    for ( i = 0; i < 64 * nWords; i++ )
    {
        Count = 0;
        for ( m = 0; m < nMints; m++ )
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        printf( "%d ", Count );
    }
    printf( "\n" );
*/
    for ( i = 0; i < 64 * nWords; i++ )
    {
        Count = 0;
        for ( m = 0; m < nMints; m++ )
        {
            printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        }
        printf( "  Count = %2d \n", Count );
    }
}